

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::
FunctionMocker<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::
UntypedPerformAction
          (FunctionMocker<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
           *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<const_solitaire::piles::interfaces::TableauPile_&> *pAVar1;
  ArgumentTuple *args;
  Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> action;
  void *untyped_args_local;
  void *untyped_action_local;
  FunctionMocker<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
  *this_local;
  
  action.fun_._M_invoker = (_Invoker_type)untyped_args;
  Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::Action
            ((Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> *)
             &args,(Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
                    *)untyped_action);
  pAVar1 = ActionResultHolder<solitaire::piles::interfaces::TableauPile_const&>::
           PerformAction<solitaire::piles::interfaces::TableauPile_const&(solitaire::piles::PileId)>
                     ((Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>
                       *)&args,(ArgumentTuple *)action.fun_._M_invoker);
  Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)>::~Action
            ((Action<const_solitaire::piles::interfaces::TableauPile_&(solitaire::piles::PileId)> *)
             &args);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }